

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

Literal * wasm::Literal::makeFromInt32(Literal *__return_storage_ptr__,int32_t x,Type type)

{
  BasicType BVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_80;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_58;
  undefined4 local_50;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_28;
  Type local_20;
  Type type_local;
  
  local_20.id = type.id;
  BVar1 = Type::getBasic(&local_20);
  switch(BVar1) {
  case i32:
    (__return_storage_ptr__->field_0).i32 = x;
    (__return_storage_ptr__->type).id = 2;
    break;
  case i64:
    *(long *)&__return_storage_ptr__->field_0 = (long)x;
    (__return_storage_ptr__->type).id = 3;
    break;
  case f32:
    *(float *)&__return_storage_ptr__->field_0 = (float)x;
    (__return_storage_ptr__->type).id = 4;
    break;
  case f64:
    *(double *)&__return_storage_ptr__->field_0 = (double)x;
    (__return_storage_ptr__->type).id = 5;
    break;
  case v128:
    local_70 = 2;
    local_68 = 0;
    local_58 = 2;
    local_50 = 0;
    local_40 = 2;
    local_38 = 0;
    local_28 = 2;
    local_80.i32 = x;
    ::wasm::Literal::Literal(__return_storage_ptr__,(array *)&local_80.func);
    std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&local_80.func);
    break;
  default:
    ::wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
               ,0xc3);
  }
  return __return_storage_ptr__;
}

Assistant:

static Literal makeFromInt32(int32_t x, Type type) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(int32_t(x));
      case Type::i64:
        return Literal(int64_t(x));
      case Type::f32:
        return Literal(float(x));
      case Type::f64:
        return Literal(double(x));
      case Type::v128:
        return Literal(std::array<Literal, 4>{{Literal(x),
                                               Literal(int32_t(0)),
                                               Literal(int32_t(0)),
                                               Literal(int32_t(0))}});
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }